

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O0

void __thiscall powerpc_test_cpu::test_compare(powerpc_test_cpu *this)

{
  uint32_t set_mask;
  powerpc_test_cpu *this_local;
  
  set_mask = bit_field<0,_0>::mask();
  gen_xer_values(this,0,set_mask);
  printf("Testing cmp\n");
  test_instruction_CRR__(this,"cmp",0x7c042800);
  printf("Testing cmpi\n");
  test_instruction_CRI__(this,"cmpi",0x2c040000);
  printf("Testing cmpl\n");
  test_instruction_CRR__(this,"cmpl",0x7c042840);
  printf("Testing cmpli\n");
  test_instruction_CRI__(this,"cmpli",0x28040000);
  return;
}

Assistant:

void powerpc_test_cpu::test_compare(void)
{
#if TEST_COMPARE
	gen_xer_values(0, SO);
	TEST_INSTRUCTION(CRR__,"cmp",		_X (31,00,RA,RB,000,0));
	TEST_INSTRUCTION(CRI__,"cmpi",		_D (11,00,RA,00));
	TEST_INSTRUCTION(CRR__,"cmpl",		_X (31,00,RA,RB, 32,0));
	TEST_INSTRUCTION(CRK__,"cmpli",		_D (10,00,RA,00));
#endif
}